

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pushDownWhereTerms(Parse *pParse,Select *pSubq,Expr *pWhere,SrcList *pSrcList,int iSrc)

{
  Select **ppSVar1;
  byte *pbVar2;
  ExprList *pEVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  Select *pSVar7;
  CollSeq *pCVar8;
  Expr *pEVar9;
  Select *pSVar10;
  int iVar11;
  ExprList_item *pEVar12;
  long lVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  undefined1 local_90 [24];
  ExprList *pEStack_78;
  ExprList *local_70;
  Walker local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar11 = 0;
  iVar5 = 0;
  if (((pWhere != (Expr *)0x0) && (iVar5 = iVar11, (pSubq->selFlags & 0x2002000) == 0)) &&
     ((pSrcList->a[iSrc].fg.jointype & 0x50) == 0)) {
    if (pSubq->pPrior == (Select *)0x0) {
      if ((pSubq->pWin != (Window *)0x0) && (pSubq->pWin->pPartition == (ExprList *)0x0))
      goto LAB_0018b7a1;
    }
    else {
      bVar4 = false;
      pSVar7 = pSubq;
      do {
        if ((pSVar7->op != 0x88) && (pSVar7->op != 0x8b)) {
          bVar4 = true;
        }
        if (pSVar7->pWin != (Window *)0x0) goto LAB_0018b5c3;
        pSVar7 = pSVar7->pPrior;
      } while (pSVar7 != (Select *)0x0);
      pSVar7 = pSubq;
      if (bVar4) {
        do {
          pEVar3 = pSVar7->pEList;
          if (0 < pEVar3->nExpr) {
            pEVar12 = pEVar3->a;
            lVar13 = 0;
            do {
              pCVar8 = sqlite3ExprCollSeq(pParse,pEVar12->pExpr);
              if ((pCVar8 != (CollSeq *)0x0) && (pCVar8->xCmp != binCollFunc)) goto LAB_0018b5c3;
              lVar13 = lVar13 + 1;
              pEVar12 = pEVar12 + 1;
            } while (lVar13 < pEVar3->nExpr);
          }
          ppSVar1 = &pSVar7->pPrior;
          pSVar7 = *ppSVar1;
        } while (*ppSVar1 != (Select *)0x0);
      }
    }
    if (pSubq->pLimit == (Expr *)0x0) {
      iVar11 = 0;
      if (pWhere->op == ',') {
        iVar11 = 0;
        do {
          iVar5 = pushDownWhereTerms(pParse,pSubq,pWhere->pRight,pSrcList,iSrc);
          iVar11 = iVar11 + iVar5;
          pWhere = pWhere->pLeft;
        } while (pWhere->op == ',');
      }
      iVar6 = sqlite3ExprIsSingleTableConstraint(pWhere,pSrcList,iSrc,1);
      iVar5 = iVar11;
      if (iVar6 != 0) {
        pbVar2 = (byte *)((long)&pSubq->selFlags + 3);
        *pbVar2 = *pbVar2 | 1;
        iVar5 = iVar11 + 1;
        do {
          local_70 = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
          local_90._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pEStack_78 = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
          pEVar9 = exprDup(pParse->db,pWhere,0,(EdupBuf *)0x0);
          unsetJoinExpr(pEVar9,-1,1);
          local_90._8_4_ = pSrcList->a[iSrc].iCursor;
          local_90._16_8_ = local_90._16_8_ & 0xffffffff00000000;
          pEStack_78 = pSubq->pEList;
          pSVar7 = pSubq;
          do {
            pSVar10 = pSVar7;
            pSVar7 = pSVar10->pPrior;
          } while (pSVar7 != (Select *)0x0);
          local_70 = pSVar10->pEList;
          local_90._0_8_ = pParse;
          local_90._12_4_ = local_90._8_4_;
          pEVar9 = substExpr((SubstContext *)local_90,pEVar9);
          if (pSubq->pWin != (Window *)0x0) {
            local_68.u = (anon_union_8_18_67db040d_for_u)pSubq->pWin->pPartition;
            local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)&DAT_aaaaaaaaaaaaaaaa;
            local_68.walkerDepth = -0x55555556;
            local_68.eCode = 1;
            local_68.mWFlags = 0xaaaa;
            local_68.xExprCallback = exprNodeIsConstantOrGroupBy;
            local_68.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
            local_68.pParse = pParse;
            if (pEVar9 != (Expr *)0x0) {
              sqlite3WalkExprNN(&local_68,pEVar9);
              if (local_68.eCode == 0) {
                sqlite3ExprDeleteNN(pParse->db,pEVar9);
                iVar5 = iVar11;
                break;
              }
            }
          }
          uVar14 = (ulong)(pSubq->selFlags & 8);
          pEVar9 = sqlite3ExprAnd(pParse,*(Expr **)((long)pSubq->addrOpenEphm + uVar14 * 2 + 0x1c),
                                  pEVar9);
          *(Expr **)((long)pSubq->addrOpenEphm + uVar14 * 2 + 0x1c) = pEVar9;
          pSubq = pSubq->pPrior;
        } while (pSubq != (Select *)0x0);
      }
    }
  }
LAB_0018b7a1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
LAB_0018b5c3:
  iVar5 = 0;
  goto LAB_0018b7a1;
}

Assistant:

static int pushDownWhereTerms(
  Parse *pParse,        /* Parse context (for malloc() and error reporting) */
  Select *pSubq,        /* The subquery whose WHERE clause is to be augmented */
  Expr *pWhere,         /* The WHERE clause of the outer query */
  SrcList *pSrcList,    /* The complete from clause of the outer query */
  int iSrc              /* Which FROM clause term to try to push into  */
){
  Expr *pNew;
  SrcItem *pSrc;        /* The subquery FROM term into which WHERE is pushed */
  int nChng = 0;
  pSrc = &pSrcList->a[iSrc];
  if( pWhere==0 ) return 0;
  if( pSubq->selFlags & (SF_Recursive|SF_MultiPart) ){
    return 0;           /* restrictions (2) and (11) */
  }
  if( pSrc->fg.jointype & (JT_LTORJ|JT_RIGHT) ){
    return 0;           /* restrictions (10) */
  }

  if( pSubq->pPrior ){
    Select *pSel;
    int notUnionAll = 0;
    for(pSel=pSubq; pSel; pSel=pSel->pPrior){
      u8 op = pSel->op;
      assert( op==TK_ALL || op==TK_SELECT
           || op==TK_UNION || op==TK_INTERSECT || op==TK_EXCEPT );
      if( op!=TK_ALL && op!=TK_SELECT ){
        notUnionAll = 1;
      }
#ifndef SQLITE_OMIT_WINDOWFUNC
      if( pSel->pWin ) return 0;    /* restriction (6b) */
#endif
    }
    if( notUnionAll ){
      /* If any of the compound arms are connected using UNION, INTERSECT,
      ** or EXCEPT, then we must ensure that none of the columns use a
      ** non-BINARY collating sequence. */
      for(pSel=pSubq; pSel; pSel=pSel->pPrior){
        int ii;
        const ExprList *pList = pSel->pEList;
        assert( pList!=0 );
        for(ii=0; ii<pList->nExpr; ii++){
          CollSeq *pColl = sqlite3ExprCollSeq(pParse, pList->a[ii].pExpr);
          if( !sqlite3IsBinary(pColl) ){
            return 0;  /* Restriction (8) */
          }
        }
      }
    }
  }else{
#ifndef SQLITE_OMIT_WINDOWFUNC
    if( pSubq->pWin && pSubq->pWin->pPartition==0 ) return 0;
#endif
  }

#ifdef SQLITE_DEBUG
  /* Only the first term of a compound can have a WITH clause.  But make
  ** sure no other terms are marked SF_Recursive in case something changes
  ** in the future.
  */
  {
    Select *pX;
    for(pX=pSubq; pX; pX=pX->pPrior){
      assert( (pX->selFlags & (SF_Recursive))==0 );
    }
  }
#endif

  if( pSubq->pLimit!=0 ){
    return 0; /* restriction (3) */
  }
  while( pWhere->op==TK_AND ){
    nChng += pushDownWhereTerms(pParse, pSubq, pWhere->pRight, pSrcList, iSrc);
    pWhere = pWhere->pLeft;
  }

#if 0 /* These checks now done by sqlite3ExprIsSingleTableConstraint() */
  if( ExprHasProperty(pWhere, EP_OuterON|EP_InnerON) /* (9a) */
   && (pSrcList->a[0].fg.jointype & JT_LTORJ)!=0     /* Fast pre-test of (9c) */
  ){
    int jj;
    for(jj=0; jj<iSrc; jj++){
      if( pWhere->w.iJoin==pSrcList->a[jj].iCursor ){
        /* If we reach this point, both (9a) and (9b) are satisfied.
        ** The following loop checks (9c):
        */
        for(jj++; jj<iSrc; jj++){
          if( (pSrcList->a[jj].fg.jointype & JT_RIGHT)!=0 ){
            return 0;  /* restriction (9) */
          }
        }
      }
    }
  }
  if( isLeftJoin
   && (ExprHasProperty(pWhere,EP_OuterON)==0
         || pWhere->w.iJoin!=iCursor)
  ){
    return 0; /* restriction (4) */
  }
  if( ExprHasProperty(pWhere,EP_OuterON)
   && pWhere->w.iJoin!=iCursor
  ){
    return 0; /* restriction (5) */
  }
#endif

#ifdef SQLITE_ALLOW_ROWID_IN_VIEW
  if( ViewCanHaveRowid && (pWhere->op==TK_ISNULL || pWhere->op==TK_NOTNULL) ){
    Expr *pLeft = pWhere->pLeft;
    if( ALWAYS(pLeft)
     && pLeft->op==TK_COLUMN
     && pLeft->iColumn < 0
    ){
      return 0;  /* Restriction (12) */
    }
  }
#endif

  if( sqlite3ExprIsSingleTableConstraint(pWhere, pSrcList, iSrc, 1) ){
    nChng++;
    pSubq->selFlags |= SF_PushDown;
    while( pSubq ){
      SubstContext x;
      pNew = sqlite3ExprDup(pParse->db, pWhere, 0);
      unsetJoinExpr(pNew, -1, 1);
      x.pParse = pParse;
      x.iTable = pSrc->iCursor;
      x.iNewTable = pSrc->iCursor;
      x.isOuterJoin = 0;
      x.pEList = pSubq->pEList;
      x.pCList = findLeftmostExprlist(pSubq);
      pNew = substExpr(&x, pNew);
#ifndef SQLITE_OMIT_WINDOWFUNC
      if( pSubq->pWin && 0==pushDownWindowCheck(pParse, pSubq, pNew) ){
        /* Restriction 6c has prevented push-down in this case */
        sqlite3ExprDelete(pParse->db, pNew);
        nChng--;
        break;
      }
#endif
      if( pSubq->selFlags & SF_Aggregate ){
        pSubq->pHaving = sqlite3ExprAnd(pParse, pSubq->pHaving, pNew);
      }else{
        pSubq->pWhere = sqlite3ExprAnd(pParse, pSubq->pWhere, pNew);
      }
      pSubq = pSubq->pPrior;
    }
  }
  return nChng;
}